

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O1

bool __thiscall
Rml::PropertySpecification::ParseShorthandDeclaration
          (PropertySpecification *this,PropertyDictionary *dictionary,ShorthandId shorthand_id,
          String *property_value)

{
  pointer puVar1;
  PropertyDefinition *this_00;
  element_type *peVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  PropertyId id;
  int iVar7;
  ShorthandDefinition *pSVar8;
  iterator __last;
  undefined7 in_register_00000011;
  long lVar9;
  long lVar10;
  element_type *peVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  _Head_base<0UL,_Rml::ShorthandDefinition_*,_false> _Var15;
  uint uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  StringList property_values;
  Property new_property;
  StringList local_f8;
  PropertyDictionary *local_d8;
  allocator<char> local_c9;
  _Head_base<0UL,_Rml::ShorthandDefinition_*,_false> local_c8;
  PropertySpecification *local_c0;
  String local_b8;
  undefined1 local_98 [32];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  pointer local_48 [3];
  
  if ((int)CONCAT71(in_register_00000011,shorthand_id) == 0) {
LAB_0025da5b:
    _Var15._M_head_impl = (ShorthandDefinition *)0x0;
  }
  else {
    puVar1 = (this->shorthands).
             super__Vector_base<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>,_std::allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->shorthands).
                      super__Vector_base<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>,_std::allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
        (ulong)shorthand_id) goto LAB_0025da5b;
    _Var15._M_head_impl =
         *(ShorthandDefinition **)
          &puVar1[shorthand_id]._M_t.
           super___uniq_ptr_impl<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>
           ._M_t;
  }
  if (_Var15._M_head_impl == (ShorthandDefinition *)0x0) {
    return false;
  }
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = dictionary;
  ParsePropertyValues(this,&local_f8,property_value,
                      ((_Var15._M_head_impl)->type == RecursiveCommaSeparated) + Whitespace);
  if (local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0025ddf2;
  if ((_Var15._M_head_impl)->type == Flex) {
    if (((long)*(pointer *)((long)&(_Var15._M_head_impl)->items + 8) -
         *(long *)&((_Var15._M_head_impl)->items).
                   super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_> !=
         0x30) &&
       (bVar5 = Assert("RMLUI_ASSERT(shorthand_definition->items.size() == 3)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                       ,0x118), !bVar5)) goto LAB_0025e20e;
    iVar7 = ::std::__cxx11::string::compare
                      ((char *)local_f8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar7 == 0) {
      local_98._0_8_ = local_98 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"0","");
      local_78[0] = local_68;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"0","");
      peVar11 = (element_type *)local_48;
      local_58 = peVar11;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"auto","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 local_98,local_48 + 2);
      lVar10 = -0x60;
      do {
        peVar2 = (element_type *)peVar11[-1].rule_name.field_2._M_allocated_capacity;
        if (peVar11 != peVar2) {
          operator_delete(peVar2,(ulong)((peVar11->path)._M_dataplus._M_p + 1));
        }
        peVar11 = (element_type *)&peVar11[-1].rule_name;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
    }
    else {
      local_c8._M_head_impl = _Var15._M_head_impl;
      local_c0 = this;
      local_48[2] = (pointer)property_value;
      Property::Property((Property *)local_98);
      bVar14 = 1;
      lVar10 = 0;
      do {
        lVar9 = *(long *)&((local_c8._M_head_impl)->items).
                          super__Vector_base<Rml::ShorthandItem,_std::allocator<Rml::ShorthandItem>_>
                          ._M_impl;
        this_00 = *(PropertyDefinition **)(lVar9 + 8 + lVar10 * 4);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,
                   (char *)((long)&DAT_002dc820 + (long)*(int *)((long)&DAT_002dc820 + lVar10)),
                   &local_c9);
        bVar5 = PropertyDefinition::ParseValue(this_00,(Property *)local_98,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        PropertyDictionary::SetProperty
                  (local_d8,*(PropertyId *)(lVar9 + 6 + lVar10 * 4),(Property *)local_98);
        property_value = (String *)local_48[2];
        this = local_c0;
        _Var15._M_head_impl = local_c8._M_head_impl;
        bVar14 = bVar14 & bVar5;
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      if ((bVar14 == 0) &&
         (bVar5 = Assert("RMLUI_ASSERT(result)",
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                         ,299), !bVar5)) goto LAB_0025e20e;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      Variant::~Variant((Variant *)local_98);
    }
  }
  switch(*(undefined4 *)((long)_Var15._M_head_impl + 0x20)) {
  case 0:
  case 1:
  case 5:
    goto switchD_0025dcbd_caseD_0;
  case 2:
    uVar12 = (long)local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (3 < uVar12) {
      switch(*(undefined4 *)((long)_Var15._M_head_impl + 0x20)) {
      case 0:
      case 1:
      case 2:
      case 5:
        goto switchD_0025dcbd_caseD_0;
      case 3:
        goto switchD_0025dcbd_caseD_3;
      case 4:
        goto switchD_0025dcbd_caseD_4;
      default:
        goto switchD_0025dcbd_default;
      }
    }
    uVar16 = 0;
    uVar17 = 0;
    uVar18 = 0;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    if (uVar12 == 3) {
      uVar16 = 1;
      uVar17 = 2;
      uVar18 = 1;
LAB_0025e116:
      local_b8._M_dataplus._M_p = (pointer)((ulong)uVar16 << 0x20);
      local_b8._M_string_length = CONCAT44(uVar18,uVar17);
    }
    else {
      if (uVar12 == 2) {
        uVar16 = 1;
        uVar17 = 0;
        uVar18 = 1;
        goto LAB_0025e116;
      }
      if (uVar12 == 1) goto LAB_0025e116;
      bVar5 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                     ,0x144);
      if (!bVar5) goto LAB_0025e20e;
    }
    lVar10 = 0;
    do {
      if ((*(int *)(*(long *)((long)_Var15._M_head_impl + 8) + lVar10 * 4) != 1) &&
         (bVar5 = Assert("RMLUI_ASSERT(shorthand_definition->items[i].type == ShorthandItemType::Property)"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                         ,0x149), !bVar5)) goto LAB_0025e20e;
      Property::Property((Property *)local_98);
      bVar5 = PropertyDefinition::ParseValue
                        (*(PropertyDefinition **)
                          (*(long *)((long)_Var15._M_head_impl + 8) + 8 + lVar10 * 4),
                         (Property *)local_98,
                         local_f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         *(int *)((long)&local_b8._M_dataplus._M_p + lVar10));
      if (!bVar5) {
        if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
        }
        Variant::~Variant((Variant *)local_98);
        goto LAB_0025ddf2;
      }
      id = PropertyDefinition::GetId
                     (*(PropertyDefinition **)
                       (*(long *)((long)_Var15._M_head_impl + 8) + 8 + lVar10 * 4));
      PropertyDictionary::SetProperty(local_d8,id,(Property *)local_98);
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      Variant::~Variant((Variant *)local_98);
      if (!bVar5) goto LAB_0025ddf2;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0x10);
    break;
  case 3:
switchD_0025dcbd_caseD_3:
    lVar10 = *(long *)((long)_Var15._M_head_impl + 8);
    if (*(long *)((long)_Var15._M_head_impl + 0x10) != lVar10) {
      bVar14 = 1;
      lVar9 = 6;
      uVar12 = 0;
      do {
        iVar7 = *(int *)(lVar10 + lVar9 + -6);
        if (iVar7 == 2) {
          bVar5 = ParseShorthandDeclaration
                            (this,local_d8,*(ShorthandId *)(lVar10 + lVar9),property_value);
LAB_0025dd88:
          bVar14 = bVar5 & bVar14;
        }
        else {
          if (iVar7 == 1) {
            bVar5 = ParsePropertyDeclaration
                              (this,local_d8,*(PropertyId *)(lVar10 + lVar9),property_value);
            goto LAB_0025dd88;
          }
          bVar14 = 0;
        }
        uVar12 = uVar12 + 1;
        lVar10 = *(long *)((long)_Var15._M_head_impl + 8);
        lVar9 = lVar9 + 0x10;
      } while (uVar12 < (ulong)(*(long *)((long)_Var15._M_head_impl + 0x10) - lVar10 >> 4));
      if (bVar14 == 0) goto LAB_0025ddf2;
    }
    break;
  case 4:
switchD_0025dcbd_caseD_4:
    lVar9 = 0;
    for (lVar10 = *(long *)((long)_Var15._M_head_impl + 8);
        lVar10 != *(long *)((long)_Var15._M_head_impl + 0x10); lVar10 = lVar10 + 0x10) {
      lVar9 = lVar9 + (ulong)*(byte *)(lVar10 + 4);
    }
    if ((ulong)(*(long *)((long)_Var15._M_head_impl + 0x10) -
                *(long *)((long)_Var15._M_head_impl + 8) >> 4) <=
        (ulong)(((long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) + lVar9)) {
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      lVar10 = *(long *)((long)_Var15._M_head_impl + 8);
      if (*(long *)((long)_Var15._M_head_impl + 0x10) != lVar10) {
        lVar9 = 6;
        pSVar8 = (ShorthandDefinition *)0x0;
        uVar12 = 0;
        local_c0 = this;
        do {
          if ((ulong)((long)local_f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar12) break;
          __last._M_current =
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar12;
          local_c8._M_head_impl = pSVar8;
          if (*(char *)(lVar10 + lVar9 + -1) == '\x01') {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_f8,
                       (iterator)
                       local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,__last);
            local_98._8_8_ = 0;
            *(char *)local_98._0_8_ = '\0';
            __last._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
            StringUtilities::JoinString(__last._M_current,&local_f8,',');
          }
          iVar7 = *(int *)(lVar10 + lVar9 + -6);
          if (iVar7 == 2) {
            bVar5 = ParseShorthandDeclaration
                              (local_c0,local_d8,*(ShorthandId *)(lVar10 + lVar9),__last._M_current)
            ;
LAB_0025e060:
            if (bVar5 == false) goto LAB_0025e069;
            uVar12 = uVar12 + 1;
LAB_0025e07e:
            bVar14 = *(byte *)(lVar10 + lVar9 + -1);
            bVar6 = bVar14 ^ 1;
            iVar7 = 0;
            if (bVar14 != 0) {
              iVar7 = 0xe;
            }
          }
          else {
            if (iVar7 == 1) {
              bVar5 = ParsePropertyDeclaration
                                (local_c0,local_d8,*(PropertyId *)(lVar10 + lVar9),__last._M_current
                                );
              goto LAB_0025e060;
            }
LAB_0025e069:
            if ((*(char *)(lVar10 + lVar9 + -1) == '\0') &&
               (*(char *)(lVar10 + lVar9 + -2) == '\x01')) goto LAB_0025e07e;
            bVar6 = 0;
            iVar7 = 1;
          }
          if (bVar6 == 0) goto LAB_0025e0ca;
          pSVar8 = (ShorthandDefinition *)&(local_c8._M_head_impl)->field_0x1;
          lVar10 = *(long *)((long)_Var15._M_head_impl + 8);
          lVar9 = lVar9 + 0x10;
        } while (pSVar8 < (undefined1 *)(*(long *)((long)_Var15._M_head_impl + 0x10) - lVar10 >> 4))
        ;
      }
      iVar7 = 0xe;
LAB_0025e0ca:
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      bVar5 = iVar7 == 0 || iVar7 == 0xe;
      goto LAB_0025e1d1;
    }
    goto LAB_0025ddf2;
  default:
switchD_0025dcbd_default:
    bVar5 = Assert("RMLUI_ASSERT(shorthand_definition->type == ShorthandType::Box || shorthand_definition->type == ShorthandType::FallThrough || shorthand_definition->type == ShorthandType::Replicate || shorthand_definition->type == ShorthandType::Flex)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                   ,0x193);
    if (!bVar5) {
LAB_0025e20e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
switchD_0025dcbd_caseD_0:
    if ((ulong)((long)local_f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <=
        (ulong)(*(long *)((long)_Var15._M_head_impl + 0x10) -
                *(long *)((long)_Var15._M_head_impl + 8) >> 4)) {
      bVar5 = local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if ((bVar5) ||
         (*(long *)((long)_Var15._M_head_impl + 0x10) == *(long *)((long)_Var15._M_head_impl + 8)))
      {
        uVar12 = 0;
      }
      else {
        lVar10 = 0;
        uVar13 = 0;
        uVar4 = 1;
        do {
          uVar12 = uVar4;
          Property::Property((Property *)local_98);
          bVar5 = PropertyDefinition::ParseValue
                            (*(PropertyDefinition **)
                              (*(long *)((long)_Var15._M_head_impl + 8) + 8 + lVar10),
                             (Property *)local_98,
                             local_f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar13);
          if (bVar5) {
            PropertyDictionary::SetProperty
                      (local_d8,*(PropertyId *)
                                 (*(long *)((long)_Var15._M_head_impl + 8) + 6 + lVar10),
                       (Property *)local_98);
            if ((*(int *)((long)_Var15._M_head_impl + 0x20) != 1) ||
               (iVar7 = 0,
               uVar13 < ((long)local_f8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_f8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
              uVar13 = uVar13 + 1;
              iVar7 = 0;
            }
          }
          else if (((*(int *)((long)_Var15._M_head_impl + 0x20) != 5) &&
                   (*(int *)((long)_Var15._M_head_impl + 0x20) != 0)) ||
                  (iVar7 = 0x13,
                  (ulong)(*(long *)((long)_Var15._M_head_impl + 0x10) -
                          *(long *)((long)_Var15._M_head_impl + 8) >> 4) <= uVar12)) {
            iVar7 = 1;
          }
          if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
          }
          Variant::~Variant((Variant *)local_98);
          if ((iVar7 != 0x13) && (iVar7 != 0)) {
            if (bVar5) goto LAB_0025e1cf;
            goto LAB_0025ddf2;
          }
          bVar5 = (ulong)((long)local_f8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_f8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar13;
          if (bVar5) break;
          lVar10 = lVar10 + 0x10;
          uVar4 = uVar12 + 1;
        } while (uVar12 < (ulong)(*(long *)((long)_Var15._M_head_impl + 0x10) -
                                  *(long *)((long)_Var15._M_head_impl + 8) >> 4));
      }
      if (((bVar5) || (*(int *)((long)_Var15._M_head_impl + 0x20) == 1)) ||
         (uVar12 < (ulong)(*(long *)((long)_Var15._M_head_impl + 0x10) -
                           *(long *)((long)_Var15._M_head_impl + 8) >> 4))) break;
    }
LAB_0025ddf2:
    bVar5 = false;
    goto LAB_0025e1d1;
  }
LAB_0025e1cf:
  bVar5 = true;
LAB_0025e1d1:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8);
  return bVar5;
}

Assistant:

bool PropertySpecification::ParseShorthandDeclaration(PropertyDictionary& dictionary, ShorthandId shorthand_id, const String& property_value) const
{
	const ShorthandDefinition* shorthand_definition = GetShorthand(shorthand_id);
	if (!shorthand_definition)
		return false;

	const SplitOption split_option =
		(shorthand_definition->type == ShorthandType::RecursiveCommaSeparated ? SplitOption::Comma : SplitOption::Whitespace);

	StringList property_values;
	ParsePropertyValues(property_values, property_value, split_option);
	if (property_values.empty())
		return false;

	// Handle the special behavior of the flex shorthand first, otherwise it acts like 'FallThrough'.
	if (shorthand_definition->type == ShorthandType::Flex && !property_values.empty())
	{
		RMLUI_ASSERT(shorthand_definition->items.size() == 3);
		if (property_values[0] == "none")
		{
			property_values = {"0", "0", "auto"};
		}
		else
		{
			// Default values when omitted from the 'flex' shorthand is specified here. These defaults are special
			// for this shorthand only, otherwise each underlying property has a different default value.
			const char* default_omitted_values[] = {"1", "1", "0"}; // flex-grow, flex-shrink, flex-basis
			Property new_property;
			bool result = true;
			for (int i = 0; i < 3; i++)
			{
				auto& item = shorthand_definition->items[i];
				result &= item.property_definition->ParseValue(new_property, default_omitted_values[i]);
				dictionary.SetProperty(item.property_id, new_property);
			}
			(void)result;
			RMLUI_ASSERT(result);
		}
	}

	// If this definition is a 'box'-style shorthand (x-top x-right x-bottom x-left) that needs replication.
	if (shorthand_definition->type == ShorthandType::Box && property_values.size() < 4)
	{
		// This array tells which property index each side is parsed from
		Array<int, 4> box_side_to_value_index = {0, 0, 0, 0};
		switch (property_values.size())
		{
		case 1:
			// Only one value is defined, so it is parsed onto all four sides.
			box_side_to_value_index = {0, 0, 0, 0};
			break;
		case 2:
			// Two values are defined, so the first one is parsed onto the top and bottom value, the second onto
			// the left and right.
			box_side_to_value_index = {0, 1, 0, 1};
			break;
		case 3:
			// Three values are defined, so the first is parsed into the top value, the second onto the left and
			// right, and the third onto the bottom.
			box_side_to_value_index = {0, 1, 2, 1};
			break;
		default: RMLUI_ERROR; break;
		}

		for (int i = 0; i < 4; i++)
		{
			RMLUI_ASSERT(shorthand_definition->items[i].type == ShorthandItemType::Property);
			Property new_property;
			int value_index = box_side_to_value_index[i];
			if (!shorthand_definition->items[i].property_definition->ParseValue(new_property, property_values[value_index]))
				return false;

			dictionary.SetProperty(shorthand_definition->items[i].property_definition->GetId(), new_property);
		}
	}
	else if (shorthand_definition->type == ShorthandType::RecursiveRepeat)
	{
		bool result = true;

		for (size_t i = 0; i < shorthand_definition->items.size(); i++)
		{
			const ShorthandItem& item = shorthand_definition->items[i];
			if (item.type == ShorthandItemType::Property)
				result &= ParsePropertyDeclaration(dictionary, item.property_id, property_value);
			else if (item.type == ShorthandItemType::Shorthand)
				result &= ParseShorthandDeclaration(dictionary, item.shorthand_id, property_value);
			else
				result = false;
		}

		if (!result)
			return false;
	}
	else if (shorthand_definition->type == ShorthandType::RecursiveCommaSeparated)
	{
		size_t num_optional = 0;
		for (auto& item : shorthand_definition->items)
			if (item.optional)
				num_optional += 1;

		if (property_values.size() + num_optional < shorthand_definition->items.size())
		{
			// Not enough subvalues declared.
			return false;
		}

		size_t subvalue_i = 0;
		String temp_subvalue;
		for (size_t i = 0; i < shorthand_definition->items.size() && subvalue_i < property_values.size(); i++)
		{
			bool result = false;

			const String* subvalue = &property_values[subvalue_i];

			const ShorthandItem& item = shorthand_definition->items[i];
			if (item.repeats)
			{
				property_values.erase(property_values.begin(), property_values.begin() + subvalue_i);
				temp_subvalue.clear();
				StringUtilities::JoinString(temp_subvalue, property_values);
				subvalue = &temp_subvalue;
			}

			if (item.type == ShorthandItemType::Property)
				result = ParsePropertyDeclaration(dictionary, item.property_id, *subvalue);
			else if (item.type == ShorthandItemType::Shorthand)
				result = ParseShorthandDeclaration(dictionary, item.shorthand_id, *subvalue);

			if (result)
				subvalue_i += 1;
			else if (item.repeats || !item.optional)
				return false;

			if (item.repeats)
				break;
		}
	}
	else
	{
		RMLUI_ASSERT(shorthand_definition->type == ShorthandType::Box || shorthand_definition->type == ShorthandType::FallThrough ||
			shorthand_definition->type == ShorthandType::Replicate || shorthand_definition->type == ShorthandType::Flex);

		// Abort over-specified shorthand values.
		if (property_values.size() > shorthand_definition->items.size())
			return false;

		size_t value_index = 0;
		size_t property_index = 0;

		for (; value_index < property_values.size() && property_index < shorthand_definition->items.size(); property_index++)
		{
			Property new_property;

			if (!shorthand_definition->items[property_index].property_definition->ParseValue(new_property, property_values[value_index]))
			{
				// This definition failed to parse; if we're falling through, try the next property. If there is no
				// next property, then abort!
				if (shorthand_definition->type == ShorthandType::FallThrough || shorthand_definition->type == ShorthandType::Flex)
				{
					if (property_index + 1 < shorthand_definition->items.size())
						continue;
				}
				return false;
			}

			dictionary.SetProperty(shorthand_definition->items[property_index].property_id, new_property);

			// Increment the value index, unless we're replicating the last value and we're up to the last value.
			if (shorthand_definition->type != ShorthandType::Replicate || value_index < property_values.size() - 1)
				value_index++;
		}

		// Abort if we still have values left to parse but no more properties to pass them to.
		if (shorthand_definition->type != ShorthandType::Replicate && value_index < property_values.size() &&
			property_index >= shorthand_definition->items.size())
			return false;
	}

	return true;
}